

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void colEchelonForm(MatrixXd *M,list<int,_std::allocator<int>_> *b)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  Index IVar4;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *this;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
  *other;
  Scalar *pSVar5;
  int in_EDI;
  int __x;
  list<int,_std::allocator<int>_> *this_00;
  RealScalar RVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double pivtol;
  int maxmn;
  double tp;
  double p;
  int col;
  int k;
  int j;
  int i;
  int m;
  int n;
  Scalar *in_stack_fffffffffffffdd8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 uVar8;
  int in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
  *in_stack_fffffffffffffe10;
  Index in_stack_fffffffffffffe18;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  double local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x5d5164);
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x5d5178);
  iVar2 = (int)IVar4;
  local_1c = 0;
  local_20 = 0;
  this = (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
         Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                   ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x5d51b8);
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x5d51ca);
  if ((long)this < IVar4) {
    other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
             *)Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                         ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x5d51e4);
  }
  else {
    other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
             *)Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                         ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x5d51f8);
  }
  this_00 = (list<int,_std::allocator<int>_> *)((double)(int)other * 2.2204e-16);
  RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::lpNorm<_1>
                    ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x5d5231);
  dVar7 = (double)this_00 * RVar6;
  std::__cxx11::list<int,_std::allocator<int>_>::clear
            ((list<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0);
  for (; bVar1 = local_20 < (int)IVar3, uVar8 = local_1c < iVar2 && bVar1, local_1c < iVar2 && bVar1
      ; local_20 = local_20 + 1) {
    local_30 = 2.2250738585072014e-308;
    local_28 = local_1c;
    for (local_24 = local_1c; local_24 < iVar2; local_24 = local_24 + 1) {
      __x = in_EDI;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                (in_stack_fffffffffffffde0,(Index)in_stack_fffffffffffffdd8,0x5d52e6);
      std::abs(__x);
      if (local_30 < extraout_XMM0_Qa) {
        local_28 = local_24;
        local_30 = extraout_XMM0_Qa;
      }
    }
    if (dVar7 <= local_30) {
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (this_00,(value_type_conflict *)CONCAT17(uVar8,in_stack_fffffffffffffde8));
      if (local_28 != local_1c) {
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                   (Index)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                   in_stack_fffffffffffffe08);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                   (Index)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                   in_stack_fffffffffffffe08);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        swap<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                  ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)this_00,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)CONCAT17(uVar8,in_stack_fffffffffffffde8));
      }
      in_stack_fffffffffffffde0 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffde0,(Index)in_stack_fffffffffffffdd8,0x5d548b);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (Index)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                 in_stack_fffffffffffffe08);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      operator/=(in_stack_fffffffffffffe10,
                 (Scalar *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_fffffffffffffde0,(Index)in_stack_fffffffffffffdd8,0x5d5503);
      *pSVar5 = 1.0;
      for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
        if (local_24 != local_1c) {
          in_stack_fffffffffffffdd8 =
               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_fffffffffffffde0,(Index)in_stack_fffffffffffffdd8,0x5d5560);
          Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (Index)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                     in_stack_fffffffffffffe08);
          Eigen::operator*(in_stack_fffffffffffffe28,(StorageBaseType *)in_stack_fffffffffffffe20);
          Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (Index)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                     in_stack_fffffffffffffe08);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          operator-=(this,other);
        }
      }
      local_1c = local_1c + 1;
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (Index)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                 in_stack_fffffffffffffe08);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              in_stack_fffffffffffffde0);
    }
  }
  return;
}

Assistant:

void colEchelonForm(Eigen::MatrixXd &M, std::list<int> &b)
{
	int n = M.rows();
	int m = M.cols();
	int i = 0, j = 0, k = 0;
	int col = 0;
	double p, tp;

	int maxmn = (M.cols()<M.rows()) ? M.rows() : M.cols();

	double pivtol = 2.2204e-16*maxmn*M.lpNorm<Eigen::Infinity>();

	b.clear();

	while ((i < m) && (j < n))
	{
		p = DBL_MIN;
		col = i;
		for (k = i; k < m; k++)
		{
			tp = std::abs(M(j, k));
			if (tp > p)
			{
				p = tp;
				col = k;
			}
		}

		if (p < pivtol)
		{
			M.block(j, i, 1, m - i).setZero();
			j++;
		}
		else
		{
			b.push_back(j);

			if (col != i)
				M.block(j, i, n - j, 1).swap(M.block(j, col, n - j, 1));

			M.block(j + 1, i, n - j - 1, 1) /= M(j, i);
			M(j, i) = 1.0;

			for (k = 0; k < m; k++)
			{
				if (k == i)
					continue;

				M.block(j, k, n - j, 1) -= M(j, k) * M.block(j, i, n - j, 1);
			}

			i++;
			j++;
		}
	}
}